

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void penalty_pc(jit_State *J,GCproto *pt,BCIns *pc,TraceError e)

{
  ushort uVar1;
  undefined2 in_CX;
  BCIns *in_RDX;
  GCproto *in_RSI;
  long in_RDI;
  uint32_t val;
  uint32_t i;
  uint local_34;
  uint local_30;
  
  local_34 = 0x48;
  local_30 = 0;
  do {
    if (0x3f < local_30) {
      local_30 = *(uint *)(in_RDI + 0x8b0);
      *(uint *)(in_RDI + 0x8b0) = *(int *)(in_RDI + 0x8b0) + 1U & 0x3f;
      *(int *)(in_RDI + 0x6b0 + (ulong)local_30 * 8) = (int)in_RDX;
LAB_0017cf14:
      *(short *)(in_RDI + 0x6b4 + (ulong)local_30 * 8) = (short)local_34;
      *(undefined2 *)(in_RDI + 0x6b6 + (ulong)local_30 * 8) = in_CX;
      *(short *)(in_RDI + 0x9a0 + (ulong)((int)in_RDX + 4U >> 2 & 0x3f) * 2) = (short)local_34;
      return;
    }
    if ((BCIns *)(ulong)*(uint *)(in_RDI + 0x6b0 + (ulong)local_30 * 8) == in_RDX) {
      uVar1 = *(ushort *)(in_RDI + 0x6b4 + (ulong)local_30 * 8);
      *(int *)(in_RDI + 0x8b4) = *(int *)(in_RDI + 0x8b4) * 0x41c64e6d + 0x3039;
      local_34 = (uint)uVar1 * 2 + (*(uint *)(in_RDI + 0x8b4) >> 0x1c);
      if (60000 < local_34) {
        blacklist_pc(in_RSI,in_RDX);
        return;
      }
      goto LAB_0017cf14;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static void penalty_pc(jit_State *J, GCproto *pt, BCIns *pc, TraceError e)
{
  uint32_t i, val = PENALTY_MIN;
  for (i = 0; i < PENALTY_SLOTS; i++)
    if (mref(J->penalty[i].pc, const BCIns) == pc) {  /* Cache slot found? */
      /* First try to bump its hotcount several times. */
      val = ((uint32_t)J->penalty[i].val << 1) +
	    LJ_PRNG_BITS(J, PENALTY_RNDBITS);
      if (val > PENALTY_MAX) {
	blacklist_pc(pt, pc);  /* Blacklist it, if that didn't help. */
	return;
      }
      goto setpenalty;
    }
  /* Assign a new penalty cache slot. */
  i = J->penaltyslot;
  J->penaltyslot = (J->penaltyslot + 1) & (PENALTY_SLOTS-1);
  setmref(J->penalty[i].pc, pc);
setpenalty:
  J->penalty[i].val = (uint16_t)val;
  J->penalty[i].reason = e;
  hotcount_set(J2GG(J), pc+1, val);
}